

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnoui.c
# Opt level: O2

void safe_strcpy(char *dst,size_t dstlen,char *src)

{
  size_t srclen;
  
  if (src == (char *)0x0) {
    srclen = 0;
  }
  else {
    srclen = strlen(src);
  }
  safe_strcpyl(dst,dstlen,src,srclen);
  return;
}

Assistant:

void safe_strcpy(char *dst, size_t dstlen, const char *src)
{
    safe_strcpyl(dst, dstlen, src, src != 0 ? strlen(src) : 0);
}